

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O3

void __thiscall
duckdb::RowGroupCollection::MergeStorage
          (RowGroupCollection *this,RowGroupCollection *data,
          optional_ptr<duckdb::DataTable,_true> table,
          optional_ptr<duckdb::StorageCommitState,_true> commit_state)

{
  unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *this_00;
  __int_type _Var1;
  _Head_base<0UL,_duckdb::PersistentCollectionData_*,_false> _Var2;
  _Head_base<0UL,_duckdb::RowGroup_*,_false> _Var3;
  optional_ptr<duckdb::StorageCommitState,_true> oVar4;
  RowGroupCollection *pRVar5;
  pointer pPVar6;
  bool bVar7;
  RowGroupSegmentTree *pRVar8;
  type this_01;
  PersistentCollectionData *pPVar9;
  pointer pRVar10;
  pointer this_02;
  PersistentColumnData *this_03;
  ulong uVar11;
  pointer pSVar12;
  SegmentNode<duckdb::RowGroup> *entry;
  pointer pSVar13;
  idx_t iVar14;
  vector<duckdb::SegmentNode<duckdb::RowGroup>,_true> segments;
  PersistentRowGroupData persistent_data;
  _Head_base<0UL,_duckdb::PersistentCollectionData_*,_false> local_e0;
  _Head_base<0UL,_duckdb::RowGroup_*,_false> local_d8;
  optional_ptr<duckdb::StorageCommitState,_true> local_d0;
  __int_type local_c8;
  RowGroupCollection *local_c0;
  PersistentCollectionData *local_b8;
  optional_ptr<duckdb::DataTable,_true> local_b0;
  vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
  local_a8;
  RowGroupCollection *local_90;
  vector<duckdb::LogicalType,_true> *local_88;
  shared_ptr<duckdb::RowGroupSegmentTree,_true> *local_80;
  pointer local_78;
  PersistentRowGroupData local_70;
  
  iVar14 = this->row_start;
  local_c8 = (this->total_rows).super___atomic_base<unsigned_long>._M_i;
  local_d0.ptr = commit_state.ptr;
  local_c0 = this;
  local_b0.ptr = table.ptr;
  pRVar8 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&data->row_groups);
  SegmentTree<duckdb::RowGroup,_true>::MoveSegments
            ((vector<duckdb::SegmentNode<duckdb::RowGroup>,_true> *)&local_a8,
             &pRVar8->super_SegmentTree<duckdb::RowGroup,_true>);
  pSVar12 = local_a8.
            super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_e0._M_head_impl = (PersistentCollectionData *)0x0;
  local_90 = data;
  if ((local_d0.ptr != (StorageCommitState *)0x0) &&
     (local_a8.
      super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_a8.
      super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    uVar11 = 0;
    pSVar13 = local_a8.
              super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      this_01 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator*
                          (&pSVar13->node);
      bVar7 = RowGroup::IsPersistent(this_01);
      if (!bVar7) break;
      uVar11 = uVar11 + (this_01->super_SegmentBase<duckdb::RowGroup>).count.
                        super___atomic_base<unsigned_long>._M_i;
      pSVar13 = pSVar13 + 1;
    } while (pSVar13 != pSVar12);
    if (uVar11 != 0) {
      pPVar9 = (PersistentCollectionData *)operator_new(0x18);
      _Var2._M_head_impl = local_e0._M_head_impl;
      (((_Vector_base<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
         *)&pPVar9->row_group_data)->_M_impl).super__Vector_impl_data._M_start = (pointer)0x0;
      (((_Vector_base<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
         *)&pPVar9->row_group_data)->_M_impl).super__Vector_impl_data._M_finish = (pointer)0x0;
      (((_Vector_base<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
         *)&pPVar9->row_group_data)->_M_impl).super__Vector_impl_data._M_end_of_storage =
           (pointer)0x0;
      bVar7 = local_e0._M_head_impl != (PersistentCollectionData *)0x0;
      local_e0._M_head_impl = pPVar9;
      if (bVar7) {
        ::std::
        vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>::
        ~vector((vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
                 *)_Var2._M_head_impl);
        operator_delete(_Var2._M_head_impl);
      }
      goto LAB_010ef669;
    }
  }
  uVar11 = 0;
LAB_010ef669:
  iVar14 = local_c8 + iVar14;
  local_78 = local_a8.
             super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_c8 = iVar14;
  if (local_a8.
      super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_a8.
      super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_88 = &local_c0->types;
    local_80 = &local_c0->row_groups;
    pSVar12 = local_a8.
              super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      this_00 = &pSVar12->node;
      pRVar10 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::
                operator->(this_00);
      RowGroup::MoveToCollection(pRVar10,local_c0,iVar14);
      if ((local_d0.ptr != (StorageCommitState *)0x0) && (iVar14 - local_c8 < uVar11)) {
        pRVar10 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::
                  operator->(this_00);
        RowGroup::SerializeRowGroupInfo(&local_70,pRVar10);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_70,
                   &local_88->
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
        this_02 = unique_ptr<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>,_true>
                  ::operator->((unique_ptr<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>,_true>
                                *)&local_e0);
        ::std::
        vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>::
        emplace_back<duckdb::PersistentRowGroupData>
                  ((vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
                    *)this_02,&local_70);
        pPVar6 = local_70.column_data.
                 super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                 .
                 super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (this_03 = local_70.column_data.
                       super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                       .
                       super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                       ._M_impl.super__Vector_impl_data._M_start; this_03 != pPVar6;
            this_03 = this_03 + 1) {
          PersistentColumnData::~PersistentColumnData(this_03);
        }
        if (local_70.column_data.
            super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
            .
            super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
            ._M_impl.super__Vector_impl_data._M_start != (PersistentColumnData *)0x0) {
          operator_delete(local_70.column_data.
                          super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                          .
                          super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_70);
      }
      pRVar10 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::
                operator->(this_00);
      _Var1 = (pRVar10->super_SegmentBase<duckdb::RowGroup>).count.
              super___atomic_base<unsigned_long>._M_i;
      pRVar8 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(local_80);
      local_d8._M_head_impl =
           (this_00->super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>).
           _M_t.super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t
           .super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
           super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl;
      (this_00->super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)._M_t.
      super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
      super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl = (RowGroup *)0x0;
      SegmentTree<duckdb::RowGroup,_true>::AppendSegment
                (&pRVar8->super_SegmentTree<duckdb::RowGroup,_true>,
                 (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
                 &local_d8);
      _Var3._M_head_impl = local_d8._M_head_impl;
      if (local_d8._M_head_impl != (RowGroup *)0x0) {
        RowGroup::~RowGroup(local_d8._M_head_impl);
        operator_delete(_Var3._M_head_impl);
      }
      iVar14 = iVar14 + _Var1;
      local_d8._M_head_impl = (RowGroup *)0x0;
      pSVar12 = pSVar12 + 1;
    } while (pSVar12 != local_78);
  }
  pRVar5 = local_90;
  if ((uVar11 != 0) && (local_d0.ptr != (StorageCommitState *)0x0)) {
    optional_ptr<duckdb::StorageCommitState,_true>::CheckValid(&local_d0);
    oVar4.ptr = local_d0.ptr;
    optional_ptr<duckdb::DataTable,_true>::CheckValid(&local_b0);
    local_b8 = local_e0._M_head_impl;
    local_e0._M_head_impl = (PersistentCollectionData *)0x0;
    (*(oVar4.ptr)->_vptr_StorageCommitState[4])(oVar4.ptr,local_b0.ptr,local_c8,uVar11);
    pPVar9 = local_b8;
    if (local_b8 != (PersistentCollectionData *)0x0) {
      ::std::vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
      ::~vector((vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
                 *)local_b8);
      operator_delete(pPVar9);
    }
    local_b8 = (PersistentCollectionData *)0x0;
  }
  TableStatistics::MergeStats(&local_c0->stats,&pRVar5->stats);
  _Var2._M_head_impl = local_e0._M_head_impl;
  LOCK();
  (local_c0->total_rows).super___atomic_base<unsigned_long>._M_i =
       (local_c0->total_rows).super___atomic_base<unsigned_long>._M_i +
       (pRVar5->total_rows).super___atomic_base<unsigned_long>._M_i;
  UNLOCK();
  if (local_e0._M_head_impl != (PersistentCollectionData *)0x0) {
    ::std::vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>::
    ~vector((vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
             *)local_e0._M_head_impl);
    operator_delete(_Var2._M_head_impl);
  }
  ::std::
  vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
  ::~vector(&local_a8);
  return;
}

Assistant:

void RowGroupCollection::MergeStorage(RowGroupCollection &data, optional_ptr<DataTable> table,
                                      optional_ptr<StorageCommitState> commit_state) {
	D_ASSERT(data.types == types);
	auto start_index = row_start + total_rows.load();
	auto index = start_index;
	auto segments = data.row_groups->MoveSegments();

	// check if the row groups we are merging are optimistically written
	// if all row groups are optimistically written we keep around the block pointers
	unique_ptr<PersistentCollectionData> row_group_data;
	idx_t optimistically_written_count = 0;
	if (commit_state) {
		for (auto &entry : segments) {
			auto &row_group = *entry.node;
			if (!row_group.IsPersistent()) {
				break;
			}
			optimistically_written_count += row_group.count;
		}
		if (optimistically_written_count > 0) {
			row_group_data = make_uniq<PersistentCollectionData>();
		}
	}
	for (auto &entry : segments) {
		auto &row_group = entry.node;
		row_group->MoveToCollection(*this, index);

		if (commit_state && (index - start_index) < optimistically_written_count) {
			// serialize the block pointers of this row group
			auto persistent_data = row_group->SerializeRowGroupInfo();
			persistent_data.types = types;
			row_group_data->row_group_data.push_back(std::move(persistent_data));
		}
		index += row_group->count;
		row_groups->AppendSegment(std::move(row_group));
	}
	if (commit_state && optimistically_written_count > 0) {
		// if we have serialized the row groups - push the serialized block pointers into the commit state
		commit_state->AddRowGroupData(*table, start_index, optimistically_written_count, std::move(row_group_data));
	}
	stats.MergeStats(data.stats);
	total_rows += data.total_rows.load();
}